

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O0

void __thiscall Fl_File_Chooser::rescan(Fl_File_Chooser *this)

{
  char cVar1;
  size_t sVar2;
  undefined8 local_820;
  char local_818 [8];
  char pathname [2048];
  Fl_File_Chooser *this_local;
  
  local_820 = this;
  fl_strlcpy(local_818,this->directory_,0x800);
  if (local_818[0] != '\0') {
    sVar2 = strlen(local_818);
    if (local_818[sVar2 - 1] != '/') {
      fl_strlcat(local_818,"/",0x800);
    }
  }
  Fl_File_Input::value(local_820->fileName,local_818);
  if ((local_820->type_ & 4U) == 0) {
    Fl_Widget::deactivate((Fl_Widget *)local_820->okButton);
  }
  else {
    Fl_Widget::activate((Fl_Widget *)local_820->okButton);
  }
  Fl_File_Browser::load(local_820->fileList,local_820->directory_,sort);
  cVar1 = Fl_Button::value((Fl_Button *)local_820->showHiddenButton);
  if (cVar1 == '\0') {
    remove_hidden_files(local_820);
  }
  update_preview(local_820);
  return;
}

Assistant:

void
Fl_File_Chooser::rescan()
{
  char	pathname[FL_PATH_MAX];		// New pathname for filename field


  // Clear the current filename
  strlcpy(pathname, directory_, sizeof(pathname));
  if (pathname[0] && pathname[strlen(pathname) - 1] != '/') {
    strlcat(pathname, "/", sizeof(pathname));
  }
//  puts("Setting fileName in rescan()");
  fileName->value(pathname);

  if (type_ & DIRECTORY)
    okButton->activate();
  else
    okButton->deactivate();

  // Build the file list...
  fileList->load(directory_, sort);
#ifndef WIN32	
  if (!showHiddenButton->value()) remove_hidden_files();
#endif
  // Update the preview box...
  update_preview();
}